

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O1

void __thiscall
QtPrivate::QPodArrayOps<LineNumber>::emplace<LineNumber>
          (QPodArrayOps<LineNumber> *this,qsizetype i,LineNumber *args)

{
  LineNumber **ppLVar1;
  qsizetype *pqVar2;
  Data *pDVar3;
  long lVar4;
  qsizetype qVar5;
  qsizetype qVar6;
  LineNumber *pLVar7;
  int iVar8;
  undefined4 uVar9;
  LineNumber *pLVar10;
  GrowthPosition where;
  
  pDVar3 = (this->super_QArrayDataPointer<LineNumber>).d;
  if ((pDVar3 == (Data *)0x0) ||
     (1 < (pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i)) {
LAB_001122f6:
    iVar8 = args->line;
    uVar9 = *(undefined4 *)&args->field_0x14;
    qVar5 = args->begin;
    qVar6 = args->end;
    where = (GrowthPosition)(i == 0 && (this->super_QArrayDataPointer<LineNumber>).size != 0);
    QArrayDataPointer<LineNumber>::detachAndGrow
              (&this->super_QArrayDataPointer<LineNumber>,where,1,(LineNumber **)0x0,
               (QArrayDataPointer<LineNumber> *)0x0);
    pLVar10 = createHole(this,where,i,1);
    pLVar10->begin = qVar5;
    pLVar10->end = qVar6;
    pLVar10->line = iVar8;
    *(undefined4 *)&pLVar10->field_0x14 = uVar9;
  }
  else {
    lVar4 = (this->super_QArrayDataPointer<LineNumber>).size;
    if ((lVar4 == i && pDVar3 != (Data *)0x0) &&
       ((pDVar3->super_QArrayData).alloc - lVar4 !=
        ((long)((long)(this->super_QArrayDataPointer<LineNumber>).ptr -
               ((ulong)((long)&pDVar3[1].super_QArrayData.alloc + 7U) & 0xfffffffffffffff0)) >> 3) *
        -0x5555555555555555)) {
      pLVar10 = (this->super_QArrayDataPointer<LineNumber>).ptr;
      uVar9 = *(undefined4 *)&args->field_0x14;
      pLVar7 = pLVar10 + lVar4;
      pLVar7->line = args->line;
      *(undefined4 *)&pLVar7->field_0x14 = uVar9;
      qVar5 = args->end;
      pLVar10 = pLVar10 + lVar4;
      pLVar10->begin = args->begin;
      pLVar10->end = qVar5;
    }
    else {
      if (((i != 0) || (pDVar3 == (Data *)0x0)) ||
         ((LineNumber *)((ulong)((long)&pDVar3[1].super_QArrayData.alloc + 7U) & 0xfffffffffffffff0)
          == (this->super_QArrayDataPointer<LineNumber>).ptr)) goto LAB_001122f6;
      pLVar10 = (this->super_QArrayDataPointer<LineNumber>).ptr;
      uVar9 = *(undefined4 *)&args->field_0x14;
      pLVar10[-1].line = args->line;
      *(undefined4 *)&pLVar10[-1].field_0x14 = uVar9;
      qVar5 = args->end;
      pLVar10[-1].begin = args->begin;
      pLVar10[-1].end = qVar5;
      ppLVar1 = &(this->super_QArrayDataPointer<LineNumber>).ptr;
      *ppLVar1 = *ppLVar1 + -1;
    }
    pqVar2 = &(this->super_QArrayDataPointer<LineNumber>).size;
    *pqVar2 = *pqVar2 + 1;
  }
  return;
}

Assistant:

void emplace(qsizetype i, Args &&... args)
    {
        bool detach = this->needsDetach();
        if (!detach) {
            if (i == this->size && this->freeSpaceAtEnd()) {
                new (this->end()) T(std::forward<Args>(args)...);
                ++this->size;
                return;
            }
            if (i == 0 && this->freeSpaceAtBegin()) {
                new (this->begin() - 1) T(std::forward<Args>(args)...);
                --this->ptr;
                ++this->size;
                return;
            }
        }
        T tmp(std::forward<Args>(args)...);
        typename QArrayData::GrowthPosition pos = QArrayData::GrowsAtEnd;
        if (this->size != 0 && i == 0)
            pos = QArrayData::GrowsAtBeginning;

        this->detachAndGrow(pos, 1, nullptr, nullptr);

        T *where = createHole(pos, i, 1);
        new (where) T(std::move(tmp));
    }